

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_rect nk_layout_space_rect_to_local(nk_context *ctx,nk_rect ret)

{
  undefined4 uVar1;
  undefined4 uVar2;
  nk_panel *pnVar3;
  undefined1 auVar4 [16];
  nk_rect nVar5;
  
  nVar5._8_8_ = ret._8_8_;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x463b,
                  "struct nk_rect nk_layout_space_rect_to_local(struct nk_context *, struct nk_rect)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    pnVar3 = ctx->current->layout;
    if (pnVar3 != (nk_panel *)0x0) {
      uVar1 = pnVar3->at_x;
      uVar2 = pnVar3->at_y;
      auVar4._4_4_ = 0;
      auVar4._0_4_ = *pnVar3->offset_x;
      auVar4._8_4_ = *pnVar3->offset_y;
      auVar4._12_4_ = 0;
      nVar5.y = ((float)(SUB168(auVar4 | _DAT_001572d0,8) - DAT_001572d0._8_8_) - (float)uVar2) +
                ret.y;
      nVar5.x = ((float)(SUB168(auVar4 | _DAT_001572d0,0) - (double)DAT_001572d0) - (float)uVar1) +
                ret.x;
      return nVar5;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x463d,
                  "struct nk_rect nk_layout_space_rect_to_local(struct nk_context *, struct nk_rect)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x463c,
                "struct nk_rect nk_layout_space_rect_to_local(struct nk_context *, struct nk_rect)")
  ;
}

Assistant:

NK_API struct nk_rect
nk_layout_space_rect_to_local(struct nk_context *ctx, struct nk_rect ret)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    win = ctx->current;
    layout = win->layout;

    ret.x += -layout->at_x + (float)*layout->offset_x;
    ret.y += -layout->at_y + (float)*layout->offset_y;
    return ret;
}